

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void __thiscall
TTD::BinaryFormatWriter::WriteNakedString
          (BinaryFormatWriter *this,TTString *val,Separator separator)

{
  bool bVar1;
  undefined7 in_register_00000011;
  uint local_20;
  Separator local_19;
  TTString *pTStack_18;
  Separator separator_local;
  TTString *val_local;
  BinaryFormatWriter *this_local;
  
  local_19 = separator;
  pTStack_18 = val;
  val_local = (TTString *)this;
  (*(this->super_FileWriter)._vptr_FileWriter[2])
            (this,(ulong)separator,CONCAT71(in_register_00000011,separator),separator);
  bVar1 = IsNullPtrTTString(pTStack_18);
  if (bVar1) {
    local_20 = 0xffffffff;
    FileWriter::WriteRawByteBuff_Fixed<unsigned_int>(&this->super_FileWriter,&local_20);
  }
  else {
    FileWriter::WriteRawByteBuff_Fixed<unsigned_int>(&this->super_FileWriter,&pTStack_18->Length);
    FileWriter::WriteRawByteBuff
              (&this->super_FileWriter,(byte *)pTStack_18->Contents,(ulong)pTStack_18->Length << 1);
  }
  return;
}

Assistant:

void BinaryFormatWriter::WriteNakedString(const TTString& val, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        if(IsNullPtrTTString(val))
        {
            this->WriteRawByteBuff_Fixed<uint32>(UINT32_MAX);
        }
        else
        {
            this->WriteRawByteBuff_Fixed<uint32>(val.Length);
            this->WriteRawByteBuff((const byte*)val.Contents, val.Length * sizeof(char16));
        }
    }